

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSLModels.cpp
# Opt level: O2

void __thiscall XPMP2::CSLModel::Unload(CSLModel *this)

{
  _List_node_base *p_Var1;
  
  p_Var1 = (_List_node_base *)&this->listObj;
  while (p_Var1 = (((_List_base<XPMP2::CSLObj,_std::allocator<XPMP2::CSLObj>_> *)&p_Var1->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->listObj) {
    CSLObj::Unload((CSLObj *)(p_Var1 + 1));
  }
  return;
}

Assistant:

void CSLModel::Unload ()
{
    for (CSLObj& o: listObj)
        o.Unload();
}